

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerWrite(PgHdr *pPg)

{
  u32 i;
  uint uVar1;
  uint uVar2;
  Pager *pPVar3;
  PagerSavepoint *pPVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  DbPage *pPg_00;
  PgHdr *pPVar9;
  sqlite3_file *pJfd;
  long lVar10;
  undefined4 *puVar11;
  uint uVar12;
  Pgno PVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  undefined8 uStack_40;
  PgHdr *pPStack_38;
  
  pPVar3 = pPg->pPager;
  if (((pPg->flags & 4) != 0) && (pPg->pgno <= pPVar3->dbSize)) {
    if (pPVar3->nSavepoint == 0) {
      return 0;
    }
    pPVar3 = pPg->pPager;
    PVar13 = pPg->pgno;
    uVar1 = pPVar3->nSavepoint;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    pPVar9 = (PgHdr *)(uVar8 * 0x38);
    iVar6 = 1;
    lVar14 = -0x58;
    lVar10 = 0x18;
    pPStack_38 = pPVar9;
    uStack_40._4_4_ = uVar1;
    while( true ) {
      if ((long)pPVar9 + lVar14 == -0x58) {
        return 0;
      }
      pPVar4 = pPVar3->aSavepoint;
      if ((PVar13 <= *(uint *)((long)pPVar4->aWalData + lVar10 + -0x24)) &&
         (iVar7 = sqlite3BitvecTestNotNull
                            (*(Bitvec **)((long)pPVar4->aWalData + lVar10 + -0x2c),PVar13),
         pPVar9 = pPStack_38, iVar7 == 0)) break;
      iVar6 = iVar6 + 1;
      lVar14 = lVar14 + -0x38;
      lVar10 = lVar10 + 0x38;
    }
    puVar11 = (undefined4 *)((long)pPVar4 - lVar14);
    for (; iVar6 < (int)uStack_40._4_4_; iVar6 = iVar6 + 1) {
      *puVar11 = 0;
      puVar11 = puVar11 + 0xe;
    }
    if (pPVar3->journalMode != '\x02') {
      pJfd = pPVar3->sjfd;
      if (pJfd->pMethods == (sqlite3_io_methods *)0x0) {
        if ((pPVar3->journalMode == '\x04') ||
           (iVar6 = sqlite3Config.nStmtSpill, pPVar3->subjInMemory != '\0')) {
          iVar6 = -1;
        }
        iVar6 = sqlite3JournalOpen(pPVar3->pVfs,(char *)0x0,pJfd,0x201e,iVar6);
        if (iVar6 != 0) {
          return iVar6;
        }
        pJfd = pPVar3->sjfd;
        PVar13 = pPg->pgno;
      }
      pvVar5 = pPg->pData;
      lVar14 = (pPVar3->pageSize + 4) * (ulong)pPVar3->nSubRec;
      iVar6 = write32bits(pJfd,lVar14,PVar13);
      if (iVar6 != 0) {
        return iVar6;
      }
      iVar6 = (*pPVar3->sjfd->pMethods->xWrite)
                        (pPVar3->sjfd,pvVar5,(int)pPVar3->pageSize,lVar14 + 4);
      if (iVar6 != 0) {
        return iVar6;
      }
      PVar13 = pPg->pgno;
    }
    pPVar3->nSubRec = pPVar3->nSubRec + 1;
    iVar6 = addToSavepointBitvecs(pPVar3,PVar13);
    return iVar6;
  }
  if (pPVar3->errCode != 0) {
    return pPVar3->errCode;
  }
  if (pPVar3->sectorSize <= (uint)pPVar3->pageSize) {
    iVar6 = pager_write(pPg);
    return iVar6;
  }
  pPVar3 = pPg->pPager;
  uVar1 = pPVar3->dbSize;
  pPVar3->doNotSpill = pPVar3->doNotSpill | 4;
  uVar2 = pPg->pgno;
  iVar6 = SUB164(ZEXT416(pPVar3->sectorSize) / SEXT816(pPVar3->pageSize),0);
  uVar12 = -iVar6 & uVar2 - 1;
  if (uVar1 < uVar2) {
    iVar7 = uVar2 - uVar12;
  }
  else {
    iVar7 = uVar1 - uVar12;
    if (uVar12 + iVar6 <= uVar1) {
      iVar7 = iVar6;
    }
  }
  PVar13 = uVar12 + 1;
  bVar16 = false;
  iVar15 = 0;
  iVar6 = 0;
  pPStack_38 = pPg;
  do {
    if ((iVar7 <= iVar15) || (iVar6 != 0)) {
      if ((iVar6 == 0) && (bVar16)) {
        iVar15 = 0;
        if (0 < iVar7) {
          iVar15 = iVar7;
        }
        while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
          pPg_00 = sqlite3PagerLookup(pPVar3,PVar13);
          if (pPg_00 != (DbPage *)0x0) {
            *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
            sqlite3PagerUnrefNotNull(pPg_00);
          }
          PVar13 = PVar13 + 1;
        }
      }
      pPVar3->doNotSpill = pPVar3->doNotSpill & 0xfb;
      return iVar6;
    }
    i = PVar13 + iVar15;
    if ((i == pPStack_38->pgno) || (iVar6 = sqlite3BitvecTest(pPVar3->pInJournal,i), iVar6 == 0)) {
      iVar6 = 0;
      if ((i != pPVar3->lckPgno) &&
         (iVar6 = (*pPVar3->xGet)(pPVar3,i,(DbPage **)&uStack_40,0), iVar6 == 0)) {
        iVar6 = pager_write(uStack_40);
        if ((uStack_40->flags & 8) != 0) {
          bVar16 = true;
        }
        goto LAB_00130e51;
      }
    }
    else {
      uStack_40 = sqlite3PagerLookup(pPVar3,i);
      iVar6 = 0;
      if (uStack_40 != (DbPage *)0x0) {
        if ((uStack_40->flags & 8) != 0) {
          bVar16 = true;
        }
LAB_00130e51:
        sqlite3PagerUnrefNotNull(uStack_40);
      }
    }
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}